

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O0

string * __thiscall
dynamicgraph::SignalBase<int>::shortName_abi_cxx11_
          (string *__return_storage_ptr__,SignalBase<int> *this)

{
  byte bVar1;
  allocator<char> local_236;
  undefined1 local_235;
  char local_228 [8];
  char buffer [128];
  istringstream aiStack_198 [4];
  int SIZE;
  istringstream iss;
  SignalBase<int> *this_local;
  string *res;
  
  std::__cxx11::istringstream::istringstream(aiStack_198,&this->name,8);
  while (bVar1 = std::ios::good(), (bVar1 & 1) != 0) {
    std::istream::getline((char *)aiStack_198,(long)local_228,-0x80);
  }
  local_235 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_228,&local_236);
  std::allocator<char>::~allocator(&local_236);
  local_235 = 1;
  std::__cxx11::istringstream::~istringstream(aiStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string shortName() const {
    std::istringstream iss(name);
    const int SIZE = 128;
    char buffer[SIZE];
    while (iss.good()) {
      iss.getline(buffer, SIZE, ':');
    }
    const std::string res(buffer);
    return res;
  }